

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O1

SCREENSHOT * create_screenshot(char *name,char *ext)

{
  SCREENSHOT *ss;
  char *pcVar1;
  
  ss = (SCREENSHOT *)malloc(0x18);
  pcVar1 = strdup(name);
  ss->name = pcVar1;
  pcVar1 = strdup(ext);
  ss->ext = pcVar1;
  ss->counter = -1;
  next_screenshot(ss);
  return ss;
}

Assistant:

SCREENSHOT *create_screenshot(char *name, char *ext)
{
   SCREENSHOT *ret = (SCREENSHOT *) malloc(sizeof(SCREENSHOT));

   ret->name = strdup(name);
   ret->ext = strdup(ext);
   ret->counter = -1;
   next_screenshot(ret);

   return ret;
}